

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

string * __thiscall
XPMP2::Aircraft::SoundGetName_abi_cxx11_
          (string *__return_storage_ptr__,Aircraft *this,SoundEventsTy sndEvent,float *volAdj)

{
  uint uVar1;
  Doc8643 *pDVar2;
  byte bVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  long *local_48 [2];
  long local_38 [2];
  
  bVar3 = this->pCSLMdl->doc8643->classification[1] - 0x30;
  if (9 < bVar3) {
    bVar3 = 0;
  }
  fVar7 = (float)(int)(char)bVar3;
  *volAdj = fVar7;
  switch((ulong)sndEvent) {
  case 0:
    bVar4 = IsGroundVehicle(this);
    if (bVar4) {
LAB_0023aeeb:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "Electric";
      pcVar5 = "";
      break;
    }
    pDVar2 = this->pCSLMdl->doc8643;
    if ((byte)(pDVar2->classification[0] + 0xb9U) < 2) {
      *volAdj = *volAdj + 1.0;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "PropHeli";
      pcVar5 = "";
      break;
    }
    bVar3 = pDVar2->classification[2];
    if (bVar3 < 0x50) {
      if (bVar3 == 0x45) goto LAB_0023aeeb;
      if (bVar3 == 0x4a) {
        bVar4 = pDVar2->classification[1] == '1';
        pcVar6 = "LoBypassJet";
        if (bVar4) {
          pcVar6 = "HiBypassJet";
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "";
        if (bVar4) {
          pcVar5 = "";
        }
        break;
      }
LAB_0023b0da:
      if (glob < 3) {
        uVar1 = this->modeS_id;
        (*this->_vptr_Aircraft[2])(local_48,this);
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
               ,0x31e,"SoundGetName",logWARN,
               "Aircraft %08X (%s): Unknown engine type \'%c\', using default engine sound",
               (ulong)uVar1,local_48[0],(ulong)(uint)(int)this->pCSLMdl->doc8643->classification[2])
        ;
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
      }
    }
    else if (bVar3 != 0x50) {
      if (bVar3 == 0x54) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "Turboprop";
        pcVar5 = "";
        break;
      }
      goto LAB_0023b0da;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "PropAirplane";
    pcVar5 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "ReverseThrust";
    pcVar5 = "";
    break;
  case 2:
    *volAdj = fVar7 * 0.5;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "RollRunway";
    pcVar5 = "";
    break;
  case 3:
    *volAdj = fVar7 * 0.25;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Gear";
    pcVar5 = "";
    break;
  case 4:
    *volAdj = fVar7 * 0.25;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "Flap";
    pcVar5 = "";
    break;
  default:
    if (glob < 4) {
      uVar1 = this->modeS_id;
      (*this->_vptr_Aircraft[2])(local_48,this);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x32a,"SoundGetName",logERR,
             "Aircraft %08X (%s): Unknown Sound Event type %d, no sound name returned",(ulong)uVar1,
             local_48[0],(ulong)sndEvent);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "";
    pcVar6 = pcVar5;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string Aircraft::SoundGetName (SoundEventsTy sndEvent, float& volAdj) const
{
    // The default is: The more engines, the louder;
    // that not ownly goes for engine sounds, but also the rest will be bigger the bigger the plane
    volAdj = float(pCSLMdl->GetNumEngines());
    // Now go by event type:
    switch (sndEvent) {
        // Engine Sound is based on aircraft classification
        case SND_ENG:
            // Sanity check: need a CSL model to derive details
            if (!pCSLMdl) {
                LOG_MSG(logWARN, "Aircraft %08X (%s): No CSL model info, using default engine sound",
                        modeS_id, GetFlightId().c_str());
                return XP_SOUND_PROP_AIRPLANE;
            }
            // Now check out engine type and return proper sound name
            if (IsGroundVehicle()) {                                // We assume all ground vehicles are electric cars by now...they should be at least ;-)
                return XP_SOUND_ELECTRIC;
            }
            if (pCSLMdl->HasRotor()) {
                volAdj += 1.0f;                                     // Helis are loud anyway, but louder with more engines
                return XP_SOUND_PROP_HELI;
            }
            switch (pCSLMdl->GetClassEngType()) {
                case 'E': return XP_SOUND_ELECTRIC;
                case 'J': return pCSLMdl->GetClassNumEng() == '1' ? XP_SOUND_HIBYPASSJET : XP_SOUND_LOBYPASSJET;
                case 'P': return XP_SOUND_PROP_AIRPLANE;
                case 'T': return XP_SOUND_TURBOPROP;
                default:
                    LOG_MSG(logWARN, "Aircraft %08X (%s): Unknown engine type '%c', using default engine sound",
                            modeS_id, GetFlightId().c_str(), pCSLMdl->GetClassEngType());
                    return XP_SOUND_PROP_AIRPLANE;
            }
            
        // All other sound types have constant sounds assigned
        case SND_REVERSE_THRUST:                        return XP_SOUND_REVERSE_THRUST;
        case SND_TIRE:              volAdj *= 0.50f;    return XP_SOUND_ROLL_RUNWAY;
        case SND_GEAR:              volAdj *= 0.25f;    return XP_SOUND_GEAR;   // that sound is too loud compared to engines, make it more quiet
        case SND_FLAPS:             volAdj *= 0.25f;    return XP_SOUND_FLAP;   // that sound is too loud compared to engines, make it more quiet
            
        default:
            LOG_MSG(logERR, "Aircraft %08X (%s): Unknown Sound Event type %d, no sound name returned",
                    modeS_id, GetFlightId().c_str(), int(sndEvent));
            return "";
    }
}